

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpfw.c
# Opt level: O1

int new_socket(int sin_family)

{
  int __fd;
  uint uVar1;
  
  __fd = socket(sin_family,2,0x11);
  if (__fd == -1) {
    __assert_fail("s != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/windrunner414[P]quicly/t/udpfw.c"
                  ,0x6a,"int new_socket(int)");
  }
  uVar1 = fcntl(__fd,3,0);
  if (uVar1 != 0xffffffff) {
    fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    return __fd;
  }
  __assert_fail("flags != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/windrunner414[P]quicly/t/udpfw.c"
                ,0x6c,"int new_socket(int)");
}

Assistant:

static int new_socket(int sin_family)
{
    int s = socket(sin_family, SOCK_DGRAM, IPPROTO_UDP);
    assert(s != -1);
    int flags = fcntl(s, F_GETFL, 0);
    assert(flags != -1);
    fcntl(s, F_SETFL, flags | O_NONBLOCK);
    return s;
}